

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.c
# Opt level: O1

void nni_plat_fini(void)

{
  if (nni_plat_inited == '\x01') {
    nni_posix_resolv_sysfini();
    nni_posix_pollq_sysfini();
  }
  pthread_mutexattr_destroy((pthread_mutexattr_t *)&nni_mxattr);
  pthread_condattr_destroy((pthread_condattr_t *)&nni_cvattr);
  pthread_attr_destroy((pthread_attr_t *)&nni_thrattr);
  nni_plat_inited = 0;
  return;
}

Assistant:

void
nni_plat_fini(void)
{
	if (nni_plat_inited) {
		nni_posix_resolv_sysfini();
		nni_posix_pollq_sysfini();
	}
	pthread_mutexattr_destroy(&nni_mxattr);
	pthread_condattr_destroy(&nni_cvattr);
	pthread_attr_destroy(&nni_thrattr);
	nni_plat_inited = false;
}